

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall
icu_63::DecimalFormat::setMinimumExponentDigits(DecimalFormat *this,int8_t minExpDig)

{
  DecimalFormatProperties *pDVar1;
  int iVar2;
  undefined7 in_register_00000031;
  UErrorCode localStatus;
  undefined8 uStack_8;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  iVar2 = (int)CONCAT71(in_register_00000031,minExpDig);
  if (pDVar1->minimumExponentDigits != iVar2) {
    pDVar1->minimumExponentDigits = iVar2;
    uStack_8 = (ulong)pDVar1 & 0xffffffff;
    touch(this,(UErrorCode *)((long)&uStack_8 + 4));
  }
  return;
}

Assistant:

void DecimalFormat::setMinimumExponentDigits(int8_t minExpDig) {
    if (minExpDig == fields->properties->minimumExponentDigits) { return; }
    fields->properties->minimumExponentDigits = minExpDig;
    touchNoError();
}